

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.c
# Opt level: O0

void us_socket_shutdown(int ssl,us_socket_t *s)

{
  int iVar1;
  us_internal_ssl_socket_t *in_RSI;
  int in_EDI;
  us_socket_t *in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffe0;
  us_loop_t *loop;
  us_internal_ssl_socket_t *p;
  
  if (in_EDI == 0) {
    iVar1 = us_socket_is_closed(0,&in_RSI->s);
    if (iVar1 == 0) {
      iVar1 = us_socket_is_shut_down(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
      if (iVar1 == 0) {
        us_internal_poll_set_type((us_poll_t *)in_RSI,1);
        loop = ((in_RSI->s).context)->loop;
        p = in_RSI;
        us_poll_events((us_poll_t *)in_RSI);
        us_poll_change((us_poll_t *)p,loop,(int)((ulong)in_RSI >> 0x20));
        us_poll_fd((us_poll_t *)p);
        bsd_shutdown_socket(0);
      }
    }
  }
  else {
    us_internal_ssl_socket_shutdown(in_RSI);
  }
  return;
}

Assistant:

void us_socket_shutdown(int ssl, struct us_socket_t *s) {
#ifndef LIBUS_NO_SSL
    if (ssl) {
        us_internal_ssl_socket_shutdown((struct us_internal_ssl_socket_t *) s);
        return;
    }
#endif

    /* Todo: should we emit on_close if calling shutdown on an already half-closed socket?
     * We need more states in that case, we need to track RECEIVED_FIN
     * so far, the app has to track this and call close as needed */
    if (!us_socket_is_closed(ssl, s) && !us_socket_is_shut_down(ssl, s)) {
        us_internal_poll_set_type(&s->p, POLL_TYPE_SOCKET_SHUT_DOWN);
        us_poll_change(&s->p, s->context->loop, us_poll_events(&s->p) & LIBUS_SOCKET_READABLE);
        bsd_shutdown_socket(us_poll_fd((struct us_poll_t *) s));
    }
}